

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O1

void SN76489_Update(SN76489_Context *chip,UINT32 length,DEV_SMPL **buffer)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  DEV_SMPL *pDVar7;
  DEV_SMPL *pDVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  UINT32 UVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  SN76489_Context *pSVar17;
  SN76489_Context *pSVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  
  bVar2 = chip->NgpFlags;
  pSVar17 = chip;
  pSVar18 = chip;
  if ((bVar2 != 0) && (pSVar18 = chip->NgpChip2, (bVar2 & 1) != 0)) {
    pSVar17 = pSVar18;
    pSVar18 = chip;
  }
  if (length != 0) {
    bVar3 = pSVar17->Mute;
    pDVar7 = *buffer;
    pDVar8 = buffer[1];
    fVar20 = chip->Clock;
    fVar1 = chip->dClock;
    uVar5 = chip->NoiseFreq;
    uVar19 = 0;
    do {
      lVar11 = 0;
      do {
        if ((bVar3 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
          fVar21 = 0.0;
        }
        else {
          fVar21 = pSVar17->IntermediatePos[lVar11];
          if ((fVar21 == 1.1754944e-38) && (!NAN(fVar21))) {
            fVar21 = (float)pSVar17->ToneFreqPos[lVar11];
          }
        }
        chip->ChannelState[lVar11] = fVar21;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if ((bVar3 & 8) == 0) {
        chip->ChannelState[3] = 0.0;
      }
      else {
        fVar21 = (float)(int)((pSVar18->NoiseShiftRegister & 1) * 2 + -1);
        chip->ChannelState[3] = fVar21;
        if ((pSVar18->Registers[6] & 4) != 0) {
          chip->ChannelState[3] = fVar21 * 0.5;
        }
      }
      pDVar7[uVar19] = 0;
      pDVar8[uVar19] = 0;
      if (bVar2 == 0) {
        bVar4 = chip->PSGStereo;
        lVar11 = -4;
        do {
          iVar16 = (int)((float)PSGVolumeValues[(ushort)chip->ToneFreqVals[lVar11 + -2]] *
                        (float)chip->panning[0][lVar11]);
          bVar9 = bVar4 >> ((char)lVar11 + 4U & 0x1f);
          if ((~bVar9 & 0x11) == 0) {
            pDVar7[uVar19] = pDVar7[uVar19] + (chip->panning[lVar11 + 4][0] * iVar16 >> 0x10);
            iVar16 = iVar16 * chip->panning[lVar11 + 4][1] >> 0x10;
          }
          else {
            iVar12 = 0;
            if ((bVar4 >> ((byte)((char)lVar11 + 4U | 4) & 0x1f) & 1) != 0) {
              iVar12 = iVar16;
            }
            pDVar7[uVar19] = pDVar7[uVar19] + iVar12;
            if ((bVar9 & 1) == 0) {
              iVar16 = 0;
            }
          }
          pDVar8[uVar19] = iVar16 + pDVar8[uVar19];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
      }
      else if ((bVar2 & 1) == 0) {
        bVar4 = chip->PSGStereo;
        lVar11 = 0;
        do {
          fVar21 = chip->ChannelState[lVar11];
          iVar16 = (int)((float)PSGVolumeValues[(ushort)pSVar17->ToneFreqVals[lVar11 + -6]] * fVar21
                        );
          if ((bVar4 >> ((byte)((byte)lVar11 | 4) & 0x1f) & 1) == 0) {
            iVar16 = 0;
          }
          pDVar7[uVar19] = pDVar7[uVar19] + iVar16;
          iVar16 = (int)((float)PSGVolumeValues[(ushort)pSVar18->ToneFreqVals[lVar11 + -6]] * fVar21
                        );
          if ((bVar4 >> ((uint)lVar11 & 0x1f) & 1) == 0) {
            iVar16 = 0;
          }
          pDVar8[uVar19] = pDVar8[uVar19] + iVar16;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      else {
        fVar21 = chip->ChannelState[3];
        bVar4 = chip->PSGStereo;
        pDVar7[uVar19] =
             pDVar7[uVar19] +
             (uint)(bVar4 >> 7) * (int)((float)PSGVolumeValues[pSVar17->Registers[7]] * fVar21);
        pDVar8[uVar19] =
             pDVar8[uVar19] +
             (bVar4 >> 3 & 1) * (int)((float)PSGVolumeValues[pSVar18->Registers[7]] * fVar21);
      }
      fVar20 = fVar20 + fVar1;
      uVar15 = (ulong)fVar20;
      UVar13 = (UINT32)uVar15;
      fVar21 = (float)(uVar15 & 0xffffffff);
      chip->NumClocksForSample = UVar13;
      fVar20 = fVar20 - fVar21;
      chip->Clock = fVar20;
      lVar11 = 0;
      do {
        chip->ToneFreqVals[lVar11] = chip->ToneFreqVals[lVar11] - UVar13;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (uVar5 == 0x80) {
        chip->ToneFreqVals[3] = chip->ToneFreqVals[2];
      }
      else {
        chip->ToneFreqVals[3] = chip->ToneFreqVals[3] - UVar13;
      }
      lVar11 = 0;
      do {
        if (chip->ToneFreqVals[lVar11] < 1) {
          uVar6 = chip->Registers[lVar11 * 2];
          if (uVar6 < 6) {
            chip->ToneFreqPos[lVar11] = 1;
            chip->IntermediatePos[lVar11] = 1.1754944e-38;
          }
          else {
            chip->IntermediatePos[lVar11] =
                 ((float)chip->ToneFreqPos[lVar11] *
                 ((float)(chip->ToneFreqVals[lVar11] * 2) + (fVar21 - fVar20))) / (fVar20 + fVar21);
            chip->ToneFreqPos[lVar11] = -chip->ToneFreqPos[lVar11];
          }
          chip->ToneFreqVals[lVar11] =
               chip->ToneFreqVals[lVar11] +
               ((int)((uVar15 & 0xffffffff) / (ulong)(uint)uVar6) + 1) * (uint)uVar6;
        }
        else {
          chip->IntermediatePos[lVar11] = 1.1754944e-38;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (chip->ToneFreqVals[3] < 1) {
        iVar16 = chip->ToneFreqPos[3];
        chip->ToneFreqPos[3] = -iVar16;
        if (uVar5 != 0x80) {
          chip->ToneFreqVals[3] =
               ((int)((uVar15 & 0xffffffff) / (ulong)uVar5) + 1) * (uint)uVar5 +
               chip->ToneFreqVals[3];
        }
        if (iVar16 == -1) {
          if ((chip->Registers[6] & 4) == 0) {
            uVar10 = chip->NoiseShiftRegister;
LAB_00127381:
            uVar10 = uVar10 & 1;
          }
          else {
            uVar10 = chip->WhiteNoiseFeedback;
            if ((uVar10 != 9) && (uVar10 != 3)) {
              uVar10 = uVar10 & chip->NoiseShiftRegister;
              uVar10 = uVar10 >> 8 ^ uVar10;
              uVar10 = uVar10 >> 4 ^ uVar10;
              uVar10 = uVar10 >> 2 ^ uVar10;
              uVar10 = uVar10 >> 1 ^ uVar10;
              goto LAB_00127381;
            }
            uVar14 = chip->NoiseShiftRegister & uVar10;
            uVar10 = (uint)(uVar14 != uVar10 && uVar14 != 0);
          }
          chip->NoiseShiftRegister =
               uVar10 << (chip->SRWidth - 1 & 0x1f) | chip->NoiseShiftRegister >> 1;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != length);
  }
  return;
}

Assistant:

static void SN76489_Update(SN76489_Context* chip, UINT32 length, DEV_SMPL **buffer)
{
	UINT32 i, j;
	SN76489_Context* chip_t;
	SN76489_Context* chip_n;
	
	if (! chip->NgpFlags)
	{
		chip_t = chip_n = chip;
	}
	else
	{
		if (! (chip->NgpFlags & 0x01))
		{
			chip_t = chip;
			chip_n = chip->NgpChip2;
		}
		else
		{
			chip_t = chip->NgpChip2;
			chip_n = chip;
		}
	}
	
	for( j = 0; j < length; j++ )
	{
		/* Tone channels */
		for ( i = 0; i <= 2; ++i )
			if ( (chip_t->Mute >> i) & 1 )
			{
				if ( chip_t->IntermediatePos[i] != FLT_MIN )
					/* Intermediate position (antialiasing) */
					chip->ChannelState[i] = chip_t->IntermediatePos[i];
				else
					/* Flat (no antialiasing needed) */
					chip->ChannelState[i] = (float)chip_t->ToneFreqPos[i];
			}
			else
				/* Muted channel */
				chip->ChannelState[i] = 0.0f;

		/* Noise channel */
		if ( (chip_t->Mute >> 3) & 1 )
		{
			//chip->Channels[3] = PSGVolumeValues[chip->Registers[7]] * ( chip_n->NoiseShiftRegister & 0x1 ) * 2; /* double noise volume */
			// Now the noise is bipolar, too. -Valley Bell
			chip->ChannelState[3] = (float)( (int)( chip_n->NoiseShiftRegister & 0x1 ) * 2 - 1 );
			// due to the way the white noise works here, it seems twice as loud as it should be
			if (chip_n->Registers[6] & 0x4 )
				chip->ChannelState[3] /= 2.0f;
		}
		else
			chip->ChannelState[3] = 0.0f;

		// Build stereo result into buffer
		buffer[0][j] = 0;
		buffer[1][j] = 0;
		if (! chip->NgpFlags)
		{
			// For all 4 channels
			for ( i = 0; i <= 3; ++i )
			{
				int chnOut = (int)(PSGVolumeValues[chip->Registers[2 * i + 1]] * chip->ChannelState[i]);
				if ( ( ( chip->PSGStereo >> i ) & 0x11 ) == 0x11 )
				{
					// no GG stereo for this channel
					buffer[0][j] += APPLY_PANNING( chnOut, chip->panning[i][0] ); // left
					buffer[1][j] += APPLY_PANNING( chnOut, chip->panning[i][1] ); // right
				}
				else
				{
					// GG stereo overrides panning
					buffer[0][j] += ( chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					buffer[1][j] += ( chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
		}
		else
		{
			int chnOut;
			if (! (chip->NgpFlags & 0x01))
			{
				// For all 3 tone channels
				for (i = 0; i < 3; i ++)
				{
					chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
			else
			{
				// noise channel
				i = 3;
				chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
				chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
			}
		}

		/* Increment clock by 1 sample length */
		chip->Clock += chip->dClock;
		chip->NumClocksForSample = (UINT32)chip->Clock;   /* truncate */
		chip->Clock -= chip->NumClocksForSample;      /* remove integer part */
	
		/* Decrement tone channel counters */
		for ( i = 0; i <= 2; ++i )
			chip->ToneFreqVals[i] -= chip->NumClocksForSample;
	 
		/* Noise channel: match to tone2 or decrement its counter */
		if ( chip->NoiseFreq == 0x80 )
			chip->ToneFreqVals[3] = chip->ToneFreqVals[2];
		else
			chip->ToneFreqVals[3] -= chip->NumClocksForSample;
	
		/* Tone channels: */
		for ( i = 0; i <= 2; ++i ) {
			if ( chip->ToneFreqVals[i] <= 0 ) {   /* If the counter gets below 0... */
				if (chip->Registers[i*2]>=PSG_CUTOFF) {
					/* For tone-generating values, calculate how much of the sample is + and how much is - */
					/* This is optimised into an even more confusing state than it was in the first place... */
					chip->IntermediatePos[i] = ( chip->NumClocksForSample - chip->Clock + 2 * chip->ToneFreqVals[i] ) * chip->ToneFreqPos[i] / ( chip->NumClocksForSample + chip->Clock );
					/* Flip the flip-flop */
					chip->ToneFreqPos[i] = -chip->ToneFreqPos[i];
				} else {
					/* stuck value */
					chip->ToneFreqPos[i] = 1;
					chip->IntermediatePos[i] = FLT_MIN;
				}
				chip->ToneFreqVals[i] += chip->Registers[i*2] * ( chip->NumClocksForSample / chip->Registers[i*2] + 1 );
			}
			else
				/* signal no antialiasing needed */
				chip->IntermediatePos[i] = FLT_MIN;
		}
	
		/* Noise channel */
		if ( chip->ToneFreqVals[3] <= 0 ) {
			/* If the counter gets below 0... */
			/* Flip the flip-flop */
			chip->ToneFreqPos[3] = -chip->ToneFreqPos[3];
			if (chip->NoiseFreq != 0x80)
				/* If not matching tone2, decrement counter */
				chip->ToneFreqVals[3] += chip->NoiseFreq * ( chip->NumClocksForSample / chip->NoiseFreq + 1 );
			if (chip->ToneFreqPos[3] == 1) {
				/* On the positive edge of the square wave (only once per cycle) */
				UINT32 Feedback;
				if ( chip->Registers[6] & 0x4 ) {
					/* White noise */
					/* Calculate parity of fed-back bits for feedback */
					switch (chip->WhiteNoiseFeedback) {
						/* Do some optimised calculations for common (known) feedback values */
					case 0x0003: /* SC-3000, BBC %00000011 */
					case 0x0009: /* SMS, GG, MD  %00001001 */
						/* If two bits fed back, I can do Feedback=(nsr & fb) && (nsr & fb ^ fb) */
						/* since that's (one or more bits set) && (not all bits set) */
						Feedback = ( ( chip->NoiseShiftRegister & chip->WhiteNoiseFeedback )
							&& ( (chip->NoiseShiftRegister & chip->WhiteNoiseFeedback ) ^ chip->WhiteNoiseFeedback ) );
						break;
					default:
						/* Default handler for all other feedback values */
						/* XOR fold bits into the final bit */
						Feedback = chip->NoiseShiftRegister & chip->WhiteNoiseFeedback;
						Feedback ^= Feedback >> 8;
						Feedback ^= Feedback >> 4;
						Feedback ^= Feedback >> 2;
						Feedback ^= Feedback >> 1;
						Feedback &= 1;
						break;
					}
				} else	  /* Periodic noise */
					Feedback=chip->NoiseShiftRegister&1;

				chip->NoiseShiftRegister=(chip->NoiseShiftRegister>>1) | (Feedback << (chip->SRWidth-1));
			}
		}
	}
}